

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O3

int nsync::note_enqueue(void *v,nsync_waiter_s *nw)

{
  int iVar1;
  nsync_dll_list_ pnVar2;
  nsync_time *pnVar3;
  uint uVar4;
  
  nsync_mu_lock((nsync_mu *)((long)v + 0x30));
  pnVar3 = (nsync_time *)&nsync_time_zero;
  if (*(int *)((long)v + 0x54) == 0) {
    if (*(int *)((long)v + 0x18) == 0) {
      pnVar3 = (nsync_time *)&nsync_time_no_deadline;
    }
    else {
      pnVar3 = (nsync_time *)((long)v + 0x20);
    }
  }
  iVar1 = nsync_time_cmp(*pnVar3,(nsync_time)ZEXT816(0));
  if (0 < iVar1) {
    pnVar2 = nsync_dll_make_last_in_list_(*(nsync_dll_list_ *)((long)v + 0x68),&nw->q);
    *(nsync_dll_list_ *)((long)v + 0x68) = pnVar2;
  }
  uVar4 = (uint)(0 < iVar1);
  (nw->waiting).super___atomic_base<unsigned_int>._M_i = uVar4;
  nsync_mu_unlock((nsync_mu *)((long)v + 0x30));
  return uVar4;
}

Assistant:

static int note_enqueue (void *v, struct nsync_waiter_s *nw) {
	int waiting = 0;
	nsync_note n = (nsync_note) v;
	nsync_time ntime;
	nsync_mu_lock (&n->note_mu);
	ntime = NOTIFIED_TIME (n);
	if (nsync_time_cmp (ntime, nsync_time_zero) > 0) {
		n->waiters = nsync_dll_make_last_in_list_ (n->waiters, &nw->q);
		ATM_STORE (&nw->waiting, 1);
		waiting = 1;
	} else {
		ATM_STORE (&nw->waiting, 0);
		waiting = 0;
	}
	nsync_mu_unlock (&n->note_mu);
	return (waiting);
}